

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fuzzing.cpp
# Opt level: O1

Expression * __thiscall wasm::TranslateToFuzzReader::makeIf(TranslateToFuzzReader *this,Type type)

{
  pointer *pppEVar1;
  uint32_t uVar2;
  Expression *pEVar3;
  Type TVar4;
  Type type_00;
  ThreeArgs local_48;
  
  pEVar3 = makeCondition(this);
  local_48.a = (Expression *)0x0;
  std::vector<wasm::Expression*,std::allocator<wasm::Expression*>>::emplace_back<wasm::Expression*>
            ((vector<wasm::Expression*,std::allocator<wasm::Expression*>> *)
             &this->funcContext->hangStack,&local_48.a);
  if (type.id == 0) {
    uVar2 = Random::upTo(&this->random,2);
    if (uVar2 == 0) {
      local_48.a = pEVar3;
      local_48.b = makeMaybeBlock(this,(Type)0x0);
      local_48.c = (Expression *)0x0;
      goto LAB_0012e348;
    }
  }
  uVar2 = Random::upTo(&this->random,0x14);
  TVar4.id = type.id;
  if (uVar2 == 1) {
    type_00.id = 1;
  }
  else {
    type_00.id = type.id;
    if (uVar2 == 0) {
      TVar4.id = 1;
    }
  }
  local_48.a = pEVar3;
  local_48.b = makeMaybeBlock(this,TVar4);
  local_48.c = makeMaybeBlock(this,type_00);
LAB_0012e348:
  pEVar3 = buildIf(this,&local_48,type);
  pppEVar1 = &(this->funcContext->hangStack).
              super__Vector_base<wasm::Expression_*,_std::allocator<wasm::Expression_*>_>._M_impl.
              super__Vector_impl_data._M_finish;
  *pppEVar1 = *pppEVar1 + -1;
  return pEVar3;
}

Assistant:

Expression* TranslateToFuzzReader::makeIf(Type type) {
  auto* condition = makeCondition();
  funcContext->hangStack.push_back(nullptr);

  Expression* ret;
  if (type == Type::none && oneIn(2)) {
    // Just an ifTrue arm.
    ret = buildIf({condition, makeMaybeBlock(type), nullptr}, type);
  } else {
    // Also an ifFalse arm.

    // Some of the time make one arm unreachable (but not both, as then the if
    // as a whole would be unreachable).
    auto trueType = type;
    auto falseType = type;
    switch (upTo(20)) {
      case 0:
        trueType = Type::unreachable;
        break;
      case 1:
        falseType = Type::unreachable;
        break;
    }
    ret = buildIf(
      {condition, makeMaybeBlock(trueType), makeMaybeBlock(falseType)}, type);
  }

  funcContext->hangStack.pop_back();
  return ret;
}